

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osQueue.cpp
# Opt level: O2

bool __thiscall osQueue::Contains(osQueue *this,void *object)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  osMutex::Take(&this->Lock,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osQueue.cpp"
                ,0x95);
  iVar2 = this->NextOutIndex;
  iVar1 = this->ElementCount;
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  iVar4 = 0;
  while ((iVar3 != iVar4 && (this->Array[iVar2] != object))) {
    iVar2 = iVar2 + 1;
    if (this->MaxElements <= iVar2) {
      iVar2 = 0;
    }
    iVar4 = iVar4 + 1;
  }
  osMutex::Give(&this->Lock);
  return iVar4 < iVar1;
}

Assistant:

bool osQueue::Contains(void* object)
{
    bool rc = false;
    int index;
    int i;

    Lock.Take(__FILE__, __LINE__);

    index = NextOutIndex;

    for (i = 0; i < ElementCount; i++)
    {
        if (object == Array[index])
        {
            rc = true;
            break;
        }
        index = Increment(index);
    }

    Lock.Give();

    return rc;
}